

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitWriter.cc
# Opt level: O1

void __thiscall BitWriter::writeBitsSigned(BitWriter *this,longlong val,size_t bits)

{
  write_bits(&this->ch,&this->bit_offset,(val >> 0x3f & 1L << ((byte)bits & 0x3f)) + val,bits,
             this->pl);
  return;
}

Assistant:

void
BitWriter::writeBitsSigned(long long val, size_t bits)
{
    unsigned long long uval = 0;
    if (val < 0) {
        uval = (1ULL << bits) + static_cast<unsigned long long>(val);
    } else {
        uval = static_cast<unsigned long long>(val);
    }
    writeBits(uval, bits);
}